

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O2

void embree::avx512::
     BVHNIntersectorKHybrid<4,_4,_257,_false,_embree::avx512::VirtualCurveIntersectorK<4>,_true>::
     intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  BVH *bvh;
  bool bVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar10;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar11;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar12;
  undefined8 uVar13;
  long lVar14;
  size_t k;
  ulong uVar15;
  undefined8 unaff_RBP;
  ulong uVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM4 [64];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  float fVar28;
  float fVar30;
  float fVar31;
  float fVar32;
  undefined1 auVar29 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  vfloat4 a0;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  Precalculations pre;
  TravRayK<4,_false> tray;
  
  bvh = (BVH *)This->ptr;
  if ((bvh->root).ptr != 8) {
    aVar1 = valid_i->field_0;
    auVar25 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
    uVar15 = vpcmpeqd_avx512vl((undefined1  [16])aVar1,auVar25);
    if ((uVar15 & 0xf) != 0) {
      auVar2 = *(undefined1 (*) [16])(ray + 0x40);
      auVar3 = *(undefined1 (*) [16])(ray + 0x50);
      auVar4 = *(undefined1 (*) [16])(ray + 0x60);
      fVar6 = auVar4._0_4_;
      auVar21._0_4_ = fVar6 * fVar6;
      fVar7 = auVar4._4_4_;
      auVar21._4_4_ = fVar7 * fVar7;
      fVar8 = auVar4._8_4_;
      auVar21._8_4_ = fVar8 * fVar8;
      fVar9 = auVar4._12_4_;
      auVar21._12_4_ = fVar9 * fVar9;
      auVar19 = vfmadd231ps_fma(auVar21,auVar3,auVar3);
      auVar19 = vfmadd231ps_fma(auVar19,auVar2,auVar2);
      auVar18 = vrsqrt14ps_avx512vl(auVar19);
      auVar35._8_4_ = 0xbf000000;
      auVar35._0_8_ = 0xbf000000bf000000;
      auVar35._12_4_ = 0xbf000000;
      auVar19 = vmulps_avx512vl(auVar19,auVar35);
      fVar28 = auVar18._0_4_;
      fVar30 = auVar18._4_4_;
      fVar31 = auVar18._8_4_;
      fVar32 = auVar18._12_4_;
      auVar26._0_4_ = fVar28 * fVar28 * fVar28 * auVar19._0_4_;
      auVar26._4_4_ = fVar30 * fVar30 * fVar30 * auVar19._4_4_;
      auVar26._8_4_ = fVar31 * fVar31 * fVar31 * auVar19._8_4_;
      auVar26._12_4_ = fVar32 * fVar32 * fVar32 * auVar19._12_4_;
      auVar19._8_4_ = 0x3fc00000;
      auVar19._0_8_ = 0x3fc000003fc00000;
      auVar19._12_4_ = 0x3fc00000;
      pre.depth_scale.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
           vfmadd231ps_avx512vl(auVar26,auVar18,auVar19);
      auVar27._8_4_ = 0x80000000;
      auVar27._0_8_ = 0x8000000080000000;
      auVar27._12_4_ = 0x80000000;
      uVar16 = CONCAT44((int)((ulong)unaff_RBP >> 0x20),(uint)((byte)uVar15 & 0xf));
      auVar18._12_4_ = 0;
      auVar18._0_12_ = ZEXT812(0);
      auVar18 = auVar18 << 0x20;
      uVar15 = uVar16;
      while (uVar15 != 0) {
        lVar14 = 0;
        for (uVar17 = uVar15; (uVar17 & 1) == 0; uVar17 = uVar17 >> 1 | 0x8000000000000000) {
          lVar14 = lVar14 + 1;
        }
        uVar15 = uVar15 - 1 & uVar15;
        uVar17 = (ulong)(uint)((int)lVar14 * 4);
        auVar19 = vinsertps_avx(ZEXT416(*(uint *)(ray + uVar17 + 0x40)),
                                ZEXT416(*(uint *)(ray + uVar17 + 0x50)),0x1c);
        auVar19 = vinsertps_avx(auVar19,ZEXT416(*(uint *)(ray + uVar17 + 0x60)),0x28);
        fVar28 = *(float *)((long)pre.ray_space + (uVar17 - 0x10));
        auVar36._0_4_ = auVar19._0_4_ * fVar28;
        auVar36._4_4_ = auVar19._4_4_ * fVar28;
        auVar36._8_4_ = auVar19._8_4_ * fVar28;
        auVar36._12_4_ = auVar19._12_4_ * fVar28;
        auVar35 = vshufpd_avx(auVar36,auVar36,1);
        auVar19 = vmovshdup_avx(auVar36);
        auVar21 = vunpckhps_avx(auVar36,auVar18);
        auVar26 = vshufps_avx(auVar21,ZEXT416(auVar19._0_4_ ^ 0x80000000),0x41);
        auVar38._0_8_ = auVar35._0_8_ ^ 0x8000000080000000;
        auVar38._8_8_ = auVar35._8_8_ ^ auVar27._8_8_;
        auVar19 = vdpps_avx(auVar26,auVar26,0x7f);
        auVar21 = vinsertps_avx(auVar38,auVar36,0x2a);
        auVar35 = vdpps_avx(auVar21,auVar21,0x7f);
        uVar13 = vcmpps_avx512vl(auVar35,auVar19,1);
        auVar19 = vpmovm2d_avx512vl(uVar13);
        auVar41._0_4_ = auVar19._0_4_;
        auVar41._4_4_ = auVar41._0_4_;
        auVar41._8_4_ = auVar41._0_4_;
        auVar41._12_4_ = auVar41._0_4_;
        uVar17 = vpmovd2m_avx512vl(auVar41);
        auVar20._4_4_ = (uint)((byte)(uVar17 >> 1) & 1) * auVar25._4_4_;
        auVar20._0_4_ = (uint)((byte)uVar17 & 1) * auVar25._0_4_;
        auVar20._8_4_ = (uint)((byte)(uVar17 >> 2) & 1) * auVar25._8_4_;
        auVar20._12_4_ = (uint)((byte)(uVar17 >> 3) & 1) * auVar25._12_4_;
        auVar19 = vblendvps_avx(auVar21,auVar26,auVar20);
        auVar35 = vdpps_avx(auVar19,auVar19,0x7f);
        auVar21 = vrsqrt14ss_avx512f(auVar18,ZEXT416((uint)auVar35._0_4_));
        fVar30 = auVar21._0_4_;
        fVar30 = fVar30 * 1.5 - auVar35._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        auVar39._0_4_ = auVar19._0_4_ * fVar30;
        auVar39._4_4_ = auVar19._4_4_ * fVar30;
        auVar39._8_4_ = auVar19._8_4_ * fVar30;
        auVar39._12_4_ = auVar19._12_4_ * fVar30;
        auVar19 = vshufps_avx(auVar39,auVar39,0xc9);
        auVar35 = vshufps_avx(auVar36,auVar36,0xc9);
        auVar42._0_4_ = auVar39._0_4_ * auVar35._0_4_;
        auVar42._4_4_ = auVar39._4_4_ * auVar35._4_4_;
        auVar42._8_4_ = auVar39._8_4_ * auVar35._8_4_;
        auVar42._12_4_ = auVar39._12_4_ * auVar35._12_4_;
        auVar19 = vfmsub231ps_fma(auVar42,auVar36,auVar19);
        auVar35 = vshufps_avx(auVar19,auVar19,0xc9);
        auVar19 = vdpps_avx(auVar35,auVar35,0x7f);
        auVar21 = vrsqrt14ss_avx512f(auVar18,ZEXT416((uint)auVar19._0_4_));
        fVar30 = auVar21._0_4_;
        fVar30 = fVar30 * 1.5 - auVar19._0_4_ * 0.5 * fVar30 * fVar30 * fVar30;
        auVar40._0_4_ = fVar30 * auVar35._0_4_;
        auVar40._4_4_ = fVar30 * auVar35._4_4_;
        auVar40._8_4_ = fVar30 * auVar35._8_4_;
        auVar40._12_4_ = fVar30 * auVar35._12_4_;
        auVar37._0_4_ = fVar28 * auVar36._0_4_;
        auVar37._4_4_ = fVar28 * auVar36._4_4_;
        auVar37._8_4_ = fVar28 * auVar36._8_4_;
        auVar37._12_4_ = fVar28 * auVar36._12_4_;
        auVar21 = vunpcklps_avx(auVar39,auVar37);
        auVar19 = vunpckhps_avx(auVar39,auVar37);
        auVar26 = vunpcklps_avx(auVar40,auVar18);
        auVar35 = vunpckhps_avx(auVar40,auVar18);
        aVar11 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar19,auVar35);
        aVar12 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar21,auVar26);
        aVar10 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar21,auVar26);
        pre.ray_space[lVar14].vx.field_0 = aVar12;
        pre.ray_space[lVar14].vy.field_0 = aVar10;
        pre.ray_space[lVar14].vz.field_0 = aVar11;
      }
      tray.org.field_0._0_4_ = *(undefined4 *)ray;
      tray.org.field_0._4_4_ = *(undefined4 *)(ray + 4);
      tray.org.field_0._8_4_ = *(undefined4 *)(ray + 8);
      tray.org.field_0._12_4_ = *(undefined4 *)(ray + 0xc);
      tray.org.field_0._16_4_ = *(undefined4 *)(ray + 0x10);
      tray.org.field_0._20_4_ = *(undefined4 *)(ray + 0x14);
      tray.org.field_0._24_4_ = *(undefined4 *)(ray + 0x18);
      tray.org.field_0._28_4_ = *(undefined4 *)(ray + 0x1c);
      auVar29._8_4_ = 0x7fffffff;
      auVar29._0_8_ = 0x7fffffff7fffffff;
      auVar29._12_4_ = 0x7fffffff;
      auVar25 = vandps_avx(auVar2,auVar29);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      uVar15 = vcmpps_avx512vl(auVar25,auVar33,1);
      auVar25 = vandps_avx(auVar3,auVar29);
      uVar17 = vcmpps_avx512vl(auVar25,auVar33,1);
      tray.org.field_0._32_4_ = *(undefined4 *)(ray + 0x20);
      tray.org.field_0._36_4_ = *(undefined4 *)(ray + 0x24);
      tray.org.field_0._40_4_ = *(undefined4 *)(ray + 0x28);
      tray.org.field_0._44_4_ = *(undefined4 *)(ray + 0x2c);
      bVar5 = (bool)((byte)uVar15 & 1);
      auVar22._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar2._0_4_;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar22._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar2._4_4_;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar22._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar2._8_4_;
      bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar22._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar2._12_4_;
      bVar5 = (bool)((byte)uVar17 & 1);
      auVar23._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._0_4_;
      bVar5 = (bool)((byte)(uVar17 >> 1) & 1);
      auVar23._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._4_4_;
      bVar5 = (bool)((byte)(uVar17 >> 2) & 1);
      auVar23._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._8_4_;
      bVar5 = (bool)((byte)(uVar17 >> 3) & 1);
      auVar23._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * auVar3._12_4_;
      auVar25 = vandps_avx(auVar4,auVar29);
      uVar15 = vcmpps_avx512vl(auVar25,auVar33,1);
      bVar5 = (bool)((byte)uVar15 & 1);
      auVar24._0_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)fVar6;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      auVar24._4_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)fVar7;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      auVar24._8_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)fVar8;
      bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
      auVar24._12_4_ = (uint)bVar5 * 0x219392ef | (uint)!bVar5 * (int)fVar9;
      auVar19 = vrcp14ps_avx512vl(auVar22);
      auVar34._8_4_ = 0x3f800000;
      auVar34._0_8_ = 0x3f8000003f800000;
      auVar34._12_4_ = 0x3f800000;
      auVar25 = vfnmadd213ps_fma(auVar22,auVar19,auVar34);
      tray.rdir.field_0.field_0.x.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar19,auVar19)
      ;
      auVar19 = vrcp14ps_avx512vl(auVar23);
      auVar25 = vfnmadd213ps_fma(auVar23,auVar19,auVar34);
      tray.rdir.field_0.field_0.y.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar19,auVar19)
      ;
      auVar19 = vrcp14ps_avx512vl(auVar24);
      auVar25 = vfnmadd213ps_fma(auVar24,auVar19,auVar34);
      auVar35 = ZEXT816(0);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vfmadd132ps_fma(auVar25,auVar19,auVar19)
      ;
      tray.org_rdir.field_0._0_4_ = (float)tray.org.field_0._0_4_ * tray.rdir.field_0._0_4_;
      tray.org_rdir.field_0._4_4_ = (float)tray.org.field_0._4_4_ * tray.rdir.field_0._4_4_;
      tray.org_rdir.field_0._8_4_ = (float)tray.org.field_0._8_4_ * tray.rdir.field_0._8_4_;
      tray.org_rdir.field_0._12_4_ = (float)tray.org.field_0._12_4_ * tray.rdir.field_0._12_4_;
      tray.org_rdir.field_0._16_4_ = (float)tray.org.field_0._16_4_ * tray.rdir.field_0._16_4_;
      tray.org_rdir.field_0._20_4_ = (float)tray.org.field_0._20_4_ * tray.rdir.field_0._20_4_;
      tray.org_rdir.field_0._24_4_ = (float)tray.org.field_0._24_4_ * tray.rdir.field_0._24_4_;
      tray.org_rdir.field_0._28_4_ = (float)tray.org.field_0._28_4_ * tray.rdir.field_0._28_4_;
      tray.org_rdir.field_0._32_4_ = (float)tray.org.field_0._32_4_ * tray.rdir.field_0._32_4_;
      tray.org_rdir.field_0._36_4_ = (float)tray.org.field_0._36_4_ * tray.rdir.field_0._36_4_;
      tray.org_rdir.field_0._40_4_ = (float)tray.org.field_0._40_4_ * tray.rdir.field_0._40_4_;
      tray.org_rdir.field_0._44_4_ = (float)tray.org.field_0._44_4_ * tray.rdir.field_0._44_4_;
      uVar15 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar35,1);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x10));
      tray.nearXYZ.field_0._0_4_ = (uint)((byte)uVar15 & 1) * auVar25._0_4_;
      tray.nearXYZ.field_0._4_4_ = (uint)((byte)(uVar15 >> 1) & 1) * auVar25._4_4_;
      tray.nearXYZ.field_0._8_4_ = (uint)((byte)(uVar15 >> 2) & 1) * auVar25._8_4_;
      tray.nearXYZ.field_0._12_4_ = (uint)((byte)(uVar15 >> 3) & 1) * auVar25._12_4_;
      uVar15 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar35,5);
      auVar25 = vpbroadcastd_avx512vl(ZEXT416(0x20));
      bVar5 = (bool)((byte)uVar15 & 1);
      tray.nearXYZ.field_0._16_4_ = (uint)bVar5 * auVar25._0_4_ | (uint)!bVar5 * 0x30;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      tray.nearXYZ.field_0._20_4_ = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * 0x30;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      tray.nearXYZ.field_0._24_4_ = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * 0x30;
      bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
      tray.nearXYZ.field_0._28_4_ = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * 0x30;
      auVar25 = vpcmpeqd_avx((undefined1  [16])tray.nearXYZ.field_0.field_0.y.field_0,
                             (undefined1  [16])tray.nearXYZ.field_0.field_0.y.field_0);
      uVar15 = vcmpps_avx512vl((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar35,5);
      auVar19 = vpbroadcastd_avx512vl(ZEXT416(0x40));
      bVar5 = (bool)((byte)uVar15 & 1);
      tray.nearXYZ.field_0._32_4_ = (uint)bVar5 * auVar19._0_4_ | (uint)!bVar5 * 0x50;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      tray.nearXYZ.field_0._36_4_ = (uint)bVar5 * auVar19._4_4_ | (uint)!bVar5 * 0x50;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      tray.nearXYZ.field_0._40_4_ = (uint)bVar5 * auVar19._8_4_ | (uint)!bVar5 * 0x50;
      bVar5 = (bool)((byte)(uVar15 >> 3) & 1);
      tray.nearXYZ.field_0._44_4_ = (uint)bVar5 * auVar19._12_4_ | (uint)!bVar5 * 0x50;
      uVar15 = vpcmpeqd_avx512vl((undefined1  [16])aVar1,auVar25);
      uVar15 = uVar15 & 0xf;
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x30),auVar35);
      bVar5 = (bool)((byte)uVar15 & 1);
      tray.tnear.field_0.i[0] = (uint)bVar5 * auVar25._0_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      tray.tnear.field_0.i[1] = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      tray.tnear.field_0.i[2] = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * 0x7f800000;
      bVar5 = SUB81(uVar15 >> 3,0);
      tray.tnear.field_0.i[3] = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * 0x7f800000;
      auVar25 = vmaxps_avx512vl(*(undefined1 (*) [16])(ray + 0x80),auVar35);
      bVar5 = (bool)((byte)uVar15 & 1);
      tray.tfar.field_0.i[0] = (uint)bVar5 * auVar25._0_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)((byte)(uVar15 >> 1) & 1);
      tray.tfar.field_0.i[1] = (uint)bVar5 * auVar25._4_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = (bool)((byte)(uVar15 >> 2) & 1);
      tray.tfar.field_0.i[2] = (uint)bVar5 * auVar25._8_4_ | (uint)!bVar5 * -0x800000;
      bVar5 = SUB81(uVar15 >> 3,0);
      tray.tfar.field_0.i[3] = (uint)bVar5 * auVar25._12_4_ | (uint)!bVar5 * -0x800000;
      tray.dir.field_0._0_16_ = auVar2;
      tray.dir.field_0._16_16_ = auVar3;
      tray.dir.field_0._32_16_ = auVar4;
      for (; uVar16 != 0; uVar16 = uVar16 - 1 & uVar16) {
        k = 0;
        for (uVar15 = uVar16; (uVar15 & 1) == 0; uVar15 = uVar15 >> 1 | 0x8000000000000000) {
          k = k + 1;
        }
        intersect1(This,bvh,(NodeRef)(bvh->root).ptr,k,&pre,ray,&tray,context);
      }
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }